

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O1

int PHYSFS_enumerate(char *_fn,PHYSFS_EnumerateCallback cb,void *data)

{
  __PHYSFS_DIRHANDLE__ **pp_Var1;
  _func_int_void_ptr_char_ptr_PHYSFS_Stat_ptr *p_Var2;
  _func_PHYSFS_EnumerateCallbackResult_void_ptr_char_ptr_PHYSFS_EnumerateCallback_char_ptr_void_ptr
  *p_Var3;
  PHYSFS_ErrorCode errcode;
  DirHandle *pDVar4;
  PHYSFS_EnumerateCallback p_Var5;
  char *pcVar6;
  int iVar7;
  PHYSFS_EnumerateCallbackResult PVar8;
  size_t sVar9;
  ulong *puVar10;
  ErrState *pEVar11;
  uint uVar12;
  __PHYSFS_DIRHANDLE__ *h;
  ulong *puVar13;
  void *pvVar14;
  DirHandle *dst;
  bool bVar15;
  undefined1 local_a8 [8];
  PHYSFS_Stat statbuf;
  PHYSFS_EnumerateCallback p_Stack_78;
  SymlinkFilterData filterdata;
  DirHandle *local_48;
  char *arcfname;
  PHYSFS_EnumerateCallback local_38;
  
  puVar13 = (ulong *)local_a8;
  if ((_fn == (char *)0x0) || (cb == (PHYSFS_EnumerateCallback)0x0)) {
    PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
    return 0;
  }
  __PHYSFS_platformGrabMutex(stateLock);
  sVar9 = strlen(_fn);
  if (sVar9 + longest_root + 1 < 0x100) {
    puVar10 = (ulong *)(local_a8 + -(longest_root + sVar9 + 0x18 & 0xfffffffffffffff0));
    puVar13 = puVar10;
  }
  else {
    puVar10 = (ulong *)0x0;
  }
  bVar15 = puVar10 == (ulong *)0x0;
  if (bVar15) {
    puVar13[-1] = 0x108404;
    puVar10 = (ulong *)(*__PHYSFS_AllocatorHooks.Malloc)(longest_root + sVar9 + 9);
  }
  if (puVar10 == (ulong *)0x0) {
    statbuf._32_8_ = (ulong *)0x0;
  }
  else {
    *puVar10 = (ulong)bVar15;
    statbuf._32_8_ = puVar10 + 1;
  }
  if ((ulong *)statbuf._32_8_ == (ulong *)0x0) {
    puVar13[-1] = 0x1085bb;
    PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
    puVar13[-1] = 0x1085c7;
    __PHYSFS_platformReleaseMutex(stateLock);
    return 0;
  }
  dst = (DirHandle *)(longest_root + statbuf._32_8_);
  local_38 = cb;
  puVar13[-1] = 0x10843d;
  iVar7 = sanitizePlatformIndependentPath(_fn,(char *)dst);
  if (iVar7 != 0) {
    if (allowSymLinks == 0) {
      filterdata.callbackData = (void *)0x0;
      filterdata.dirhandle = (DirHandle *)0x0;
      filterdata.arcfname = (char *)0x0;
      p_Stack_78 = local_38;
      filterdata.callback = (PHYSFS_EnumerateCallback)data;
    }
    h = searchPath;
    pcVar6 = (char *)data;
    if (searchPath != (DirHandle *)0x0) {
      do {
        arcfname = pcVar6;
        local_48 = dst;
        puVar13[-1] = 0x108490;
        iVar7 = partOfMountPoint(h,(char *)dst);
        p_Var5 = local_38;
        if (iVar7 == 0) {
          puVar13[-1] = 0x1084bc;
          iVar7 = verifyPath(h,(char **)&local_48,0);
          pDVar4 = local_48;
          if (iVar7 == 0) {
            PVar8 = PHYSFS_ENUM_OK;
          }
          else {
            pvVar14 = h->opaque;
            p_Var2 = h->funcs->stat;
            puVar13[-1] = 0x1084d8;
            iVar7 = (*p_Var2)(pvVar14,(char *)pDVar4,(PHYSFS_Stat *)local_a8);
            if (iVar7 == 0) {
              puVar13[-1] = 0x1084f1;
              pEVar11 = findErrorForCurrentThread();
              if (pEVar11 == (ErrState *)0x0) {
                bVar15 = true;
              }
              else {
                bVar15 = pEVar11->code != PHYSFS_ERR_NOT_FOUND;
              }
              PVar8 = PHYSFS_ENUM_OK;
              data = arcfname;
              if (!bVar15) goto LAB_00108539;
            }
            p_Var5 = local_38;
            pcVar6 = arcfname;
            PVar8 = PHYSFS_ENUM_OK;
            data = arcfname;
            if ((int)statbuf.accesstime == 1) {
              if ((allowSymLinks == 0) && ((h->funcs->info).supportsSymlinks != 0)) {
                filterdata.dirhandle = pDVar4;
                filterdata.arcfname = (char *)((ulong)filterdata.arcfname & 0xffffffff00000000);
                pvVar14 = h->opaque;
                p_Var3 = h->funcs->enumerate;
                filterdata.callbackData = h;
                puVar13[-1] = 0x108582;
                PVar8 = (*p_Var3)(pvVar14,(char *)pDVar4,enumCallbackFilterSymLinks,_fn,&p_Stack_78)
                ;
                data = arcfname;
                if (PVar8 == PHYSFS_ENUM_ERROR) {
                  puVar13[-1] = 0x10858f;
                  pEVar11 = findErrorForCurrentThread();
                  PVar8 = PHYSFS_ENUM_ERROR;
                  data = arcfname;
                  if ((pEVar11 != (ErrState *)0x0) && (pEVar11->code == PHYSFS_ERR_APP_CALLBACK)) {
                    errcode = (PHYSFS_ErrorCode)filterdata.arcfname;
                    puVar13[-1] = 0x1085a8;
                    PHYSFS_setErrorCode(errcode);
                    data = arcfname;
                  }
                }
              }
              else {
                pvVar14 = h->opaque;
                p_Var3 = h->funcs->enumerate;
                puVar13[-1] = 0x108532;
                PVar8 = (*p_Var3)(pvVar14,(char *)pDVar4,p_Var5,_fn,pcVar6);
                data = arcfname;
              }
            }
          }
        }
        else {
          puVar13[-1] = 0x1084a9;
          PVar8 = enumerateFromMountPoint(h,(char *)dst,p_Var5,_fn,data);
        }
LAB_00108539:
      } while ((PVar8 == PHYSFS_ENUM_OK) &&
              (pp_Var1 = &h->next, h = *pp_Var1, pcVar6 = arcfname,
              *pp_Var1 != (__PHYSFS_DIRHANDLE__ *)0x0));
      uVar12 = (uint)(PVar8 != PHYSFS_ENUM_ERROR);
      goto LAB_001085d5;
    }
  }
  uVar12 = 1;
LAB_001085d5:
  puVar13[-1] = 0x1085e1;
  __PHYSFS_platformReleaseMutex(stateLock);
  if (*(long *)(statbuf._32_8_ + -8) != 0) {
    pvVar14 = (void *)(statbuf._32_8_ + -8);
    puVar13[-1] = 0x1085fa;
    (*__PHYSFS_AllocatorHooks.Free)(pvVar14);
    return uVar12;
  }
  return uVar12;
}

Assistant:

int PHYSFS_enumerate(const char *_fn, PHYSFS_EnumerateCallback cb, void *data)
{
    PHYSFS_EnumerateCallbackResult retval = PHYSFS_ENUM_OK;
    size_t len;
    char *allocated_fname;
    char *fname;

    BAIL_IF(!_fn, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!cb, PHYSFS_ERR_INVALID_ARGUMENT, 0);

    __PHYSFS_platformGrabMutex(stateLock);

    len = strlen(_fn) + longest_root + 1;
    allocated_fname = (char *) __PHYSFS_smallAlloc(len);
    BAIL_IF_MUTEX(!allocated_fname, PHYSFS_ERR_OUT_OF_MEMORY, stateLock, 0);
    fname = allocated_fname + longest_root;
    if (!sanitizePlatformIndependentPath(_fn, fname))
        retval = PHYSFS_ENUM_STOP;
    else
    {
        DirHandle *i;
        SymlinkFilterData filterdata;

        if (!allowSymLinks)
        {
            memset(&filterdata, '\0', sizeof (filterdata));
            filterdata.callback = cb;
            filterdata.callbackData = data;
        } /* if */

        for (i = searchPath; (retval == PHYSFS_ENUM_OK) && i; i = i->next)
        {
            char *arcfname = fname;

            if (partOfMountPoint(i, arcfname))
                retval = enumerateFromMountPoint(i, arcfname, cb, _fn, data);

            else if (verifyPath(i, &arcfname, 0))
            {
                PHYSFS_Stat statbuf;
                if (!i->funcs->stat(i->opaque, arcfname, &statbuf))
                {
                    if (currentErrorCode() == PHYSFS_ERR_NOT_FOUND)
                        continue;  /* no such dir in this archive, skip it. */
                } /* if */

                if (statbuf.filetype != PHYSFS_FILETYPE_DIRECTORY)
                    continue;  /* not a directory in this archive, skip it. */

                else if ((!allowSymLinks) && (i->funcs->info.supportsSymlinks))
                {
                    filterdata.dirhandle = i;
                    filterdata.arcfname = arcfname;
                    filterdata.errcode = PHYSFS_ERR_OK;
                    retval = i->funcs->enumerate(i->opaque, arcfname,
                                                 enumCallbackFilterSymLinks,
                                                 _fn, &filterdata);
                    if (retval == PHYSFS_ENUM_ERROR)
                    {
                        if (currentErrorCode() == PHYSFS_ERR_APP_CALLBACK)
                            PHYSFS_setErrorCode(filterdata.errcode);
                    } /* if */
                } /* else if */
                else
                {
                    retval = i->funcs->enumerate(i->opaque, arcfname,
                                                 cb, _fn, data);
                } /* else */
            } /* else if */
        } /* for */

    } /* if */

    __PHYSFS_platformReleaseMutex(stateLock);

    __PHYSFS_smallFree(allocated_fname);

    return (retval == PHYSFS_ENUM_ERROR) ? 0 : 1;
}